

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall ThreadedReplayer::enqueue_work_item(ThreadedReplayer *this,PipelineWorkItem *item)

{
  std::mutex::lock(&this->pipeline_work_queue_mutex);
  std::deque<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>::push_back
            (&(this->pipeline_work_queue).c,item);
  std::condition_variable::notify_one();
  this->queued_count[item->memory_context_index] =
       this->queued_count[item->memory_context_index] + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
  return;
}

Assistant:

void enqueue_work_item(const PipelineWorkItem &item)
	{
		lock_guard<mutex> lock(pipeline_work_queue_mutex);
		pipeline_work_queue.push(item);
		work_available_condition.notify_one();
		queued_count[item.memory_context_index]++;
	}